

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_rotate.c
# Opt level: O3

void gdImageSkewX(gdImagePtr dst,gdImagePtr src,int uRow,int iOffset,double dWeight,int clrBack,
                 int ignoretransparent)

{
  uint color;
  uint uVar1;
  uint color_00;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int b;
  int iVar6;
  int g;
  int color_01;
  int a;
  code *local_40;
  
  if (src->trueColor == 0) {
    color_01 = src->green[clrBack] * 0x100 + src->red[clrBack] * 0x10000 + src->blue[clrBack] +
               src->alpha[clrBack] * 0x1000000;
    local_40 = gdImageGetPixel;
  }
  else {
    local_40 = gdImageGetTrueColorPixel;
    color_01 = clrBack;
  }
  if (iOffset < 1) {
    iVar6 = 0;
  }
  else {
    iVar5 = 0;
    do {
      gdImageSetPixel(dst,iVar5,uRow,color_01);
      iVar5 = iVar5 + 1;
      iVar6 = iOffset;
    } while (iOffset != iVar5);
  }
  if (iVar6 < dst->sx) {
    gdImageSetPixel(dst,iVar6,uRow,color_01);
  }
  if (src->sx < 1) {
    iVar6 = 0;
    color_00 = 0;
  }
  else {
    iVar6 = 0;
    do {
      color = (*local_40)(src,iVar6,uRow);
      if (src->trueColor == 0) {
        uVar2 = src->red[(int)color];
        uVar3 = src->green[(int)color];
        uVar4 = src->blue[(int)color];
        uVar1 = src->alpha[(int)color];
      }
      else {
        uVar2 = color >> 0x10 & 0xff;
        uVar3 = color >> 8 & 0xff;
        uVar4 = color & 0xff;
        uVar1 = color >> 0x18 & 0x7f;
      }
      color_00 = gdImageColorAllocateAlpha
                           (src,(int)((double)(int)uVar2 * dWeight),
                            (int)((double)(int)uVar3 * dWeight),(int)((double)(int)uVar4 * dWeight),
                            (int)((double)(int)uVar1 * dWeight));
      if (color_00 == 0xffffffff) {
        color_00 = gdImageColorClosestAlpha
                             (src,(int)((double)(int)uVar2 * dWeight),
                              (int)((double)(int)uVar3 * dWeight),
                              (int)((double)(int)uVar4 * dWeight),
                              (int)((double)(int)uVar1 * dWeight));
      }
      if (src->trueColor == 0) {
        iVar5 = (src->red[(int)color] - src->red[(int)color_00]) + src->red[clrBack];
        g = (src->green[(int)color] - src->green[(int)color_00]) + src->green[clrBack];
        b = (src->blue[(int)color] - src->blue[(int)color_00]) + src->blue[clrBack];
        uVar2 = src->alpha[(int)color];
        uVar3 = src->alpha[(int)color_00];
        uVar4 = src->alpha[clrBack];
      }
      else {
        iVar5 = (((uint)clrBack >> 0x10 & 0xff) + (color >> 0x10 & 0xff)) -
                (color_00 >> 0x10 & 0xff);
        g = (((uint)clrBack >> 8 & 0xff) + (color >> 8 & 0xff)) - (color_00 >> 8 & 0xff);
        b = ((clrBack & 0xffU) + (color & 0xff)) - (color_00 & 0xff);
        uVar2 = color >> 0x18 & 0x7f;
        uVar3 = color_00 >> 0x18 & 0x7f;
        uVar4 = (uint)clrBack >> 0x18 & 0x7f;
      }
      if (0xfe < iVar5) {
        iVar5 = 0xff;
      }
      if (0xfe < g) {
        g = 0xff;
      }
      if (0xfe < b) {
        b = 0xff;
      }
      a = (uVar2 - uVar3) + uVar4;
      if (0x7e < a) {
        a = 0x7f;
      }
      if (((ignoretransparent == 0) || (color != dst->transparent)) &&
         (color = gdImageColorAllocateAlpha(dst,iVar5,g,b,a), color == 0xffffffff)) {
        color = gdImageColorClosestAlpha(dst,iVar5,g,b,a);
      }
      iVar5 = iOffset + iVar6;
      if ((-1 < iVar5) && (iVar5 < dst->sx)) {
        gdImageSetPixel(dst,iVar5,uRow,color);
      }
      iVar6 = iVar6 + 1;
      clrBack = color_00;
    } while (iVar6 < src->sx);
  }
  iVar6 = iVar6 + iOffset;
  if (iVar6 < dst->sx) {
    gdImageSetPixel(dst,iVar6,uRow,color_00);
  }
  gdImageSetPixel(dst,iOffset,uRow,color_01);
  for (; iVar6 < dst->sx; iVar6 = iVar6 + 1) {
    gdImageSetPixel(dst,iVar6,uRow,color_01);
  }
  return;
}

Assistant:

void gdImageSkewX (gdImagePtr dst, gdImagePtr src, int uRow, int iOffset, double dWeight, int clrBack, int ignoretransparent)
{
	int i, r, g, b, a, clrBackR, clrBackG, clrBackB, clrBackA;
	FuncPtr f;

	int pxlOldLeft, pxlLeft=0, pxlSrc;

	/* Keep clrBack as color index if required */
	if (src->trueColor) {
		pxlOldLeft = clrBack;
		f = gdImageGetTrueColorPixel;
	} else {
		pxlOldLeft = clrBack;
		clrBackR = gdImageRed(src, clrBack);
		clrBackG = gdImageGreen(src, clrBack);
		clrBackB = gdImageBlue(src, clrBack);
		clrBackA = gdImageAlpha(src, clrBack);
		clrBack =  gdTrueColorAlpha(clrBackR, clrBackG, clrBackB, clrBackA);
		f = gdImageGetPixel;
	}

	for (i = 0; i < iOffset; i++) {
		gdImageSetPixel (dst, i, uRow, clrBack);
	}

	if (i < dst->sx) {
		gdImageSetPixel (dst, i, uRow, clrBack);
	}

	for (i = 0; i < src->sx; i++) {
		pxlSrc = f (src,i,uRow);

		r = (int)(gdImageRed(src,pxlSrc) * dWeight);
		g = (int)(gdImageGreen(src,pxlSrc) * dWeight);
		b = (int)(gdImageBlue(src,pxlSrc) * dWeight);
		a = (int)(gdImageAlpha(src,pxlSrc) * dWeight);

		pxlLeft = gdImageColorAllocateAlpha(src, r, g, b, a);

		if (pxlLeft == -1) {
			pxlLeft = gdImageColorClosestAlpha(src, r, g, b, a);
		}

		r = gdImageRed(src,pxlSrc) - (gdImageRed(src,pxlLeft) - gdImageRed(src,pxlOldLeft));
		g = gdImageGreen(src,pxlSrc) - (gdImageGreen(src,pxlLeft) - gdImageGreen(src,pxlOldLeft));
		b = gdImageBlue(src,pxlSrc) - (gdImageBlue(src,pxlLeft) - gdImageBlue(src,pxlOldLeft));
		a = gdImageAlpha(src,pxlSrc) - (gdImageAlpha(src,pxlLeft) - gdImageAlpha(src,pxlOldLeft));

		if (r>255) {
			r = 255;
		}

		if (g>255) {
			g = 255;
		}

		if (b>255) {
			b = 255;
		}

		if (a>127) {
			a = 127;
		}

		if (ignoretransparent && pxlSrc == dst->transparent) {
			pxlSrc = dst->transparent;
		} else {
			pxlSrc = gdImageColorAllocateAlpha(dst, r, g, b, a);

			if (pxlSrc == -1) {
				pxlSrc = gdImageColorClosestAlpha(dst, r, g, b, a);
			}
		}

		if ((i + iOffset >= 0) && (i + iOffset < dst->sx)) {
			gdImageSetPixel (dst, i+iOffset, uRow,  pxlSrc);
		}

		pxlOldLeft = pxlLeft;
	}

	i += iOffset;

	if (i < dst->sx) {
		gdImageSetPixel (dst, i, uRow, pxlLeft);
	}

	gdImageSetPixel (dst, iOffset, uRow, clrBack);

	i--;

	while (++i < dst->sx) {
		gdImageSetPixel (dst, i, uRow, clrBack);
	}
}